

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::InsertSyntheticTestCase(string *name,CodeLocation *location,bool has_test_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  char *__s;
  pointer pcVar3;
  UnitTestImpl *pUVar4;
  _func_int **pp_Var5;
  const_iterator cVar6;
  long *plVar7;
  TestFactoryBase *factory;
  size_type *psVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  undefined1 local_458 [8];
  char kMissingInstantiation [378];
  char kMissingTestCase [348];
  size_type *local_170;
  string full_name;
  string message;
  _func_int **local_128;
  undefined1 local_120;
  uint7 uStack_11f;
  _func_int **pp_Stack_118;
  TestFactoryBase *local_110;
  _func_int **local_108;
  TestFactoryBase local_100;
  _func_int **pp_Stack_f8;
  int local_f0;
  undefined1 local_e8 [8];
  size_type __dnew;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  TestFactoryBase *local_c8;
  undefined8 local_c0;
  TestFactoryBase local_b8;
  _func_int **pp_Stack_b0;
  int local_a8;
  CodeLocation local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  allocator<char> local_31;
  
  UnitTest::GetInstance();
  pUVar4 = UnitTest::GetInstance::instance.impl_;
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&((UnitTest::GetInstance::instance.impl_)->ignored_parameterized_test_suites_)._M_t
                 ,name);
  if ((_Rb_tree_header *)cVar6._M_node ==
      &(pUVar4->ignored_parameterized_test_suites_)._M_t._M_impl.super__Rb_tree_header) {
    memcpy(local_458,
           " is defined via TEST_P, but never instantiated. None of the test cases will run. Either no INSTANTIATE_TEST_SUITE_P is provided or the only ones provided expand to nothing.\n\nIdeally, TEST_P definitions should only ever be included as part of binaries that intend to use them. (As opposed to, for example, being placed in a library that may be linked in to get other utilities.)"
           ,0x17a);
    memcpy(kMissingInstantiation + 0x178,
           " is instantiated via INSTANTIATE_TEST_SUITE_P, but no tests are defined via TEST_P . No test cases will run.\n\nIdeally, INSTANTIATE_TEST_SUITE_P should only ever be invoked from code that always depend on code that provides TEST_P. Failing to do so is often an indication of dead code, e.g. the last TEST_P was removed but the rest got left behind."
           ,0x15c);
    std::operator+(&local_78,"Parameterized test suite ",name);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_78);
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_58.field_2._M_allocated_capacity = *psVar8;
      local_58.field_2._8_8_ = plVar7[3];
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    }
    else {
      local_58.field_2._M_allocated_capacity = *psVar8;
      local_58._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_58._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_58);
    paVar1 = &local_a0.file.field_2;
    psVar8 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_a0.file.field_2._M_allocated_capacity = *psVar8;
      local_a0.file.field_2._8_8_ = plVar7[3];
      local_a0.file._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_a0.file.field_2._M_allocated_capacity = *psVar8;
      local_a0.file._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_a0.file._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_a0,(ulong)(name->_M_dataplus)._M_p);
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar9) {
      local_d8._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_d8._8_8_ = plVar7[3];
      local_e8 = (undefined1  [8])&local_d8;
    }
    else {
      local_d8._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_e8 = (undefined1  [8])*plVar7;
    }
    __dnew = plVar7[1];
    *plVar7 = (long)paVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append(local_e8);
    full_name.field_2._8_8_ = &message._M_string_length;
    psVar8 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar8) {
      message._M_string_length = *psVar8;
      message.field_2._M_allocated_capacity = plVar7[3];
    }
    else {
      message._M_string_length = *psVar8;
      full_name.field_2._8_8_ = (size_type *)*plVar7;
    }
    message._M_dataplus._M_p = (pointer)plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if (local_e8 != (undefined1  [8])&local_d8) {
      operator_delete((void *)local_e8,(ulong)(local_d8._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.file._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0.file._M_dataplus._M_p,local_a0.file.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                               local_78.field_2._M_local_buf[0]) + 1);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                   "UninstantiatedParameterizedTestSuite<",name);
    plVar7 = (long *)std::__cxx11::string::append(local_e8);
    local_170 = &full_name._M_string_length;
    psVar8 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar8) {
      full_name._M_string_length = *psVar8;
      full_name.field_2._M_allocated_capacity = plVar7[3];
    }
    else {
      full_name._M_string_length = *psVar8;
      local_170 = (size_type *)*plVar7;
    }
    full_name._M_dataplus._M_p = (pointer)plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if (local_e8 != (undefined1  [8])&local_d8) {
      operator_delete((void *)local_e8,(ulong)(local_d8._M_allocated_capacity + 1));
    }
    __s = (location->file)._M_dataplus._M_p;
    iVar2 = location->line;
    message.field_2._8_8_ = &local_120;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)&message.field_2 + 8),full_name.field_2._8_8_,
               message._M_dataplus._M_p + full_name.field_2._8_8_);
    local_110 = &local_100;
    pcVar3 = (location->file)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,pcVar3,pcVar3 + (location->file)._M_string_length);
    local_f0 = location->line;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_e8 = (undefined1  [8])0x16;
    local_58._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)local_e8);
    local_58.field_2._M_allocated_capacity = (size_type)local_e8;
    builtin_strncpy(local_58._M_dataplus._M_p,"GoogleTestVerification",0x16);
    local_58._M_string_length = (size_type)local_e8;
    local_58._M_dataplus._M_p[(long)local_e8] = '\0';
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,__s,&local_31);
    local_a0.file._M_dataplus._M_p = (pointer)&local_a0.file.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) {
      local_a0.file.field_2._8_8_ = local_78.field_2._8_8_;
    }
    else {
      local_a0.file._M_dataplus._M_p = local_78._M_dataplus._M_p;
    }
    local_a0.file.field_2._M_allocated_capacity._1_7_ = local_78.field_2._M_allocated_capacity._1_7_
    ;
    local_a0.file.field_2._M_local_buf[0] = local_78.field_2._M_local_buf[0];
    local_a0.file._M_string_length = local_78._M_string_length;
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    local_a0.line = iVar2;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    factory = (TestFactoryBase *)operator_new(0x50);
    pp_Var5 = local_108;
    if ((undefined1 *)message.field_2._8_8_ == &local_120) {
      local_d8._8_8_ = pp_Stack_118;
      message.field_2._8_8_ = &local_d8;
    }
    local_d8._M_allocated_capacity._1_7_ = uStack_11f;
    local_d8._M_local_buf[0] = local_120;
    local_120 = 0;
    if (local_110 == &local_100) {
      pp_Stack_b0 = pp_Stack_f8;
      local_110 = &local_b8;
    }
    local_b8._vptr_TestFactoryBase._1_7_ = local_100._vptr_TestFactoryBase._1_7_;
    local_b8._vptr_TestFactoryBase._0_1_ = local_100._vptr_TestFactoryBase._0_1_;
    local_108 = (_func_int **)0x0;
    local_100._vptr_TestFactoryBase._0_1_ = 0;
    local_a8 = local_f0;
    factory->_vptr_TestFactoryBase =
         (_func_int **)
         (
         _ZTVZN7testing12RegisterTestITpTnRiJEZNS_8internal23InsertSyntheticTestCaseERKNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEENS2_12CodeLocationEbE3__0EEPNS_8TestInfoEPKcSG_SG_SG_SG_iT0_E11FactoryImpl
         + 0x10);
    factory[1]._vptr_TestFactoryBase = (_func_int **)(factory + 3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)message.field_2._8_8_ == &local_d8) {
      factory[3]._vptr_TestFactoryBase = (_func_int **)local_d8._M_allocated_capacity;
      factory[4]._vptr_TestFactoryBase = (_func_int **)local_d8._8_8_;
    }
    else {
      factory[1]._vptr_TestFactoryBase = (_func_int **)message.field_2._8_8_;
      factory[3]._vptr_TestFactoryBase = (_func_int **)local_d8._M_allocated_capacity;
    }
    factory[2]._vptr_TestFactoryBase = local_128;
    __dnew = 0;
    local_d8._M_allocated_capacity = (ulong)uStack_11f << 8;
    factory[5]._vptr_TestFactoryBase = (_func_int **)(factory + 7);
    if (local_110 == &local_b8) {
      factory[7]._vptr_TestFactoryBase = local_b8._vptr_TestFactoryBase;
      factory[8]._vptr_TestFactoryBase = pp_Stack_b0;
    }
    else {
      factory[5]._vptr_TestFactoryBase = (_func_int **)local_110;
      factory[7]._vptr_TestFactoryBase = local_b8._vptr_TestFactoryBase;
    }
    factory[6]._vptr_TestFactoryBase = pp_Var5;
    local_c0 = 0;
    local_b8._vptr_TestFactoryBase =
         (_func_int **)((ulong)local_100._vptr_TestFactoryBase._1_7_ << 8);
    *(int *)&factory[9]._vptr_TestFactoryBase = local_f0;
    message.field_2._8_8_ = &local_120;
    local_110 = &local_100;
    local_e8 = (undefined1  [8])&local_d8;
    local_c8 = &local_b8;
    MakeAndRegisterTestInfo
              (&local_58,(char *)local_170,(char *)0x0,(char *)0x0,&local_a0,
               &TypeIdHelper<testing::internal::(anonymous_namespace)::FailureTest>::dummy_,
               (SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,factory);
    if (local_c8 != &local_b8) {
      operator_delete(local_c8,(long)local_b8._vptr_TestFactoryBase + 1);
    }
    if (local_e8 != (undefined1  [8])&local_d8) {
      operator_delete((void *)local_e8,local_d8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.file._M_dataplus._M_p != &local_a0.file.field_2) {
      operator_delete(local_a0.file._M_dataplus._M_p,local_a0.file.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                               local_78.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,
                      CONCAT71(local_100._vptr_TestFactoryBase._1_7_,
                               local_100._vptr_TestFactoryBase._0_1_) + 1);
    }
    if ((undefined1 *)message.field_2._8_8_ != &local_120) {
      operator_delete((void *)message.field_2._8_8_,CONCAT71(uStack_11f,local_120) + 1);
    }
    if (local_170 != &full_name._M_string_length) {
      operator_delete(local_170,full_name._M_string_length + 1);
    }
    if ((size_type *)full_name.field_2._8_8_ != &message._M_string_length) {
      operator_delete((void *)full_name.field_2._8_8_,message._M_string_length + 1);
    }
  }
  return;
}

Assistant:

void InsertSyntheticTestCase(const std::string& name, CodeLocation location,
                             bool has_test_p) {
  const auto& ignored = *GetIgnoredParameterizedTestSuites();
  if (ignored.find(name) != ignored.end()) return;

  const char kMissingInstantiation[] =  //
      " is defined via TEST_P, but never instantiated. None of the test "
      "cases "
      "will run. Either no INSTANTIATE_TEST_SUITE_P is provided or the only "
      "ones provided expand to nothing."
      "\n\n"
      "Ideally, TEST_P definitions should only ever be included as part of "
      "binaries that intend to use them. (As opposed to, for example, being "
      "placed in a library that may be linked in to get other utilities.)";

  const char kMissingTestCase[] =  //
      " is instantiated via INSTANTIATE_TEST_SUITE_P, but no tests are "
      "defined via TEST_P . No test cases will run."
      "\n\n"
      "Ideally, INSTANTIATE_TEST_SUITE_P should only ever be invoked from "
      "code that always depend on code that provides TEST_P. Failing to do "
      "so is often an indication of dead code, e.g. the last TEST_P was "
      "removed but the rest got left behind.";

  std::string message =
      "Parameterized test suite " + name +
      (has_test_p ? kMissingInstantiation : kMissingTestCase) +
      "\n\n"
      "To suppress this error for this test suite, insert the following line "
      "(in a non-header) in the namespace it is defined in:"
      "\n\n"
      "GTEST_ALLOW_UNINSTANTIATED_PARAMETERIZED_TEST(" +
      name + ");";

  std::string full_name = "UninstantiatedParameterizedTestSuite<" + name + ">";
  RegisterTest(  //
      "GoogleTestVerification", full_name.c_str(),
      nullptr,  // No type parameter.
      nullptr,  // No value parameter.
      location.file.c_str(), location.line, [message, location] {
        return new FailureTest(location, message,
                               kErrorOnUninstantiatedParameterizedTest);
      });
}